

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

QSize __thiscall QToolBoxButton::sizeHint(QToolBoxButton *this)

{
  undefined1 *this_00;
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  undefined8 uVar4;
  int iVar5;
  QSize QVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  QAbstractButton QStack_58;
  
  QStack_58.super_QWidget.data = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  QAbstractButton::icon(&QStack_58);
  cVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)&QStack_58);
  if (cVar1 == '\0') {
    pQVar3 = QWidget::style((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3e,0);
    iVar5 = iVar2 + 10;
    iVar2 = iVar2 + 8;
  }
  else {
    iVar2 = 8;
    iVar5 = iVar2;
  }
  this_00 = &QStack_58.super_QWidget.field_0x18;
  QWidget::fontMetrics((QWidget *)this_00);
  QAbstractButton::text((QString *)&QStack_58,&this->super_QAbstractButton);
  uVar4 = QFontMetrics::size((int)this_00,(QString *)0x800,(int)&QStack_58,(int *)0x0);
  RVar7.m_i = (int)((ulong)uVar4 >> 0x20) + 8;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&QStack_58);
  QFontMetrics::~QFontMetrics((QFontMetrics *)this_00);
  if (RVar7.m_i < iVar2) {
    RVar7.m_i = iVar2;
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == QStack_58.super_QWidget.data) {
    QVar6.wd.m_i = iVar5 + (int)uVar4;
    QVar6.ht.m_i = RVar7.m_i;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBoxButton::sizeHint() const
{
    QSize iconSize(8, 8);
    if (!icon().isNull()) {
        int icone = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, parentWidget() /* QToolBox */);
        iconSize += QSize(icone + 2, icone);
    }
    QSize textSize = fontMetrics().size(Qt::TextShowMnemonic, text()) + QSize(0, 8);

    return QSize(iconSize.width() + textSize.width(), qMax(iconSize.height(), textSize.height()));
}